

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_cluster.cpp
# Opt level: O0

MPP_RET mpp_cluster_queue_init(ClusterQueue *queue,MppCluster *cluster)

{
  pthread_mutexattr_t local_1c;
  MppCluster *pMStack_18;
  pthread_mutexattr_t attr;
  MppCluster *cluster_local;
  ClusterQueue *queue_local;
  
  pMStack_18 = cluster;
  cluster_local = (MppCluster *)queue;
  pthread_mutexattr_init(&local_1c);
  pthread_mutexattr_settype(&local_1c,1);
  pthread_mutex_init((pthread_mutex_t *)(cluster_local->name + 8),&local_1c);
  pthread_mutexattr_destroy(&local_1c);
  *(MppCluster **)cluster_local->name = pMStack_18;
  *(undefined1 **)((long)&cluster_local->queue[0].lock + 8) =
       (undefined1 *)((long)&cluster_local->queue[0].lock + 8);
  *(undefined1 **)((long)&cluster_local->queue[0].lock + 0x10) =
       (undefined1 *)((long)&cluster_local->queue[0].lock + 8);
  *(undefined4 *)((long)&cluster_local->queue[0].lock + 0x18) = 0;
  return MPP_OK;
}

Assistant:

MPP_RET mpp_cluster_queue_init(ClusterQueue *queue, MppCluster *cluster)
{
    pthread_mutexattr_t attr;

    pthread_mutexattr_init(&attr);
    pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE);
    pthread_mutex_init(&queue->lock, &attr);
    pthread_mutexattr_destroy(&attr);

    queue->cluster = cluster;
    INIT_LIST_HEAD(&queue->list);
    queue->count = 0;

    return MPP_OK;
}